

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionDuplicateExcludesTxt_Test::TestBody
          (TApp_IncorrectConstructionDuplicateExcludesTxt_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  AssertHelper local_150;
  Message local_148 [2];
  OptionAlreadyAdded *anon_var_0;
  string local_130;
  byte local_109;
  char *pcStack_108;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_f8;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *cat;
  TApp_IncorrectConstructionDuplicateExcludesTxt_Test *this_local;
  
  cat = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--cat",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--other",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    pOVar2 = local_18;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"--other",&local_e9);
      CLI::Option::excludes<CLI::App>(pOVar2,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffef8,"");
    bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                      ((ConstCharPtr *)&stack0xfffffffffffffef8);
    if (bVar1) {
      local_109 = 0;
      bVar1 = testing::internal::AlwaysTrue();
      pOVar2 = local_18;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_130,"--other",(allocator *)((long)&anon_var_0 + 7));
        CLI::Option::excludes<CLI::App>(pOVar2,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      }
      if ((local_109 & 1) != 0) {
        return;
      }
      pcStack_108 = 
      "Expected: cat->excludes(\"--other\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
      ;
    }
    testing::Message::Message(local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc9,pcStack_108);
    testing::internal::AssertHelper::operator=(&local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(local_148);
  }
  else {
    testing::Message::Message(&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,200,
               "Expected: cat->excludes(\"--other\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_f8);
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateExcludesTxt) {
    auto cat = app.add_flag("--cat");
    app.add_flag("--other");
    ASSERT_NO_THROW(cat->excludes("--other"));
    EXPECT_THROW(cat->excludes("--other"), CLI::OptionAlreadyAdded);
}